

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::MainBuilder::Impl::Arg> * __thiscall
kj::ArrayBuilder<kj::MainBuilder::Impl::Arg>::operator=
          (ArrayBuilder<kj::MainBuilder::Impl::Arg> *this,
          ArrayBuilder<kj::MainBuilder::Impl::Arg> *other)

{
  Arg *pAVar1;
  RemoveConst<kj::MainBuilder::Impl::Arg> *pRVar2;
  Arg *pAVar3;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (Arg *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->ptr = (Arg *)0x0;
    this->pos = (RemoveConst<kj::MainBuilder::Impl::Arg> *)0x0;
    this->endPtr = (Arg *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pAVar1,0x28,((long)pRVar2 - (long)pAVar1 >> 3) * -0x3333333333333333,
               ((long)pAVar3 - (long)pAVar1 >> 3) * -0x3333333333333333,
               ArrayDisposer::Dispose_<kj::MainBuilder::Impl::Arg>::destruct);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Arg *)0x0;
  other->pos = (RemoveConst<kj::MainBuilder::Impl::Arg> *)0x0;
  other->endPtr = (Arg *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }